

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterStartDTDAttlist(xmlTextWriterPtr writer,xmlChar *name)

{
  int iVar1;
  int iVar2;
  xmlLinkPtr lk_00;
  void *pvVar3;
  long *data;
  xmlChar *pxVar4;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlChar *name_local;
  xmlTextWriterPtr writer_local;
  
  if (((writer == (xmlTextWriterPtr)0x0) || (name == (xmlChar *)0x0)) || (*name == '\0')) {
    writer_local._4_4_ = -1;
  }
  else {
    lk._0_4_ = 0;
    lk_00 = xmlListFront(writer->nodes);
    if (lk_00 == (xmlLinkPtr)0x0) {
      writer_local._4_4_ = -1;
    }
    else {
      pvVar3 = xmlLinkGetData(lk_00);
      if ((pvVar3 != (void *)0x0) && (iVar1 = *(int *)((long)pvVar3 + 8), iVar1 != 0)) {
        if (iVar1 == 7) {
          lk._0_4_ = xmlOutputBufferWriteString(writer->out," [");
          if ((int)lk < 0) {
            return -1;
          }
          if (writer->indent != 0) {
            iVar1 = xmlOutputBufferWriteString(writer->out,"\n");
            if (iVar1 < 0) {
              return -1;
            }
            lk._0_4_ = iVar1 + (int)lk;
          }
          *(undefined4 *)((long)pvVar3 + 8) = 8;
        }
        else if (iVar1 != 8) {
          return -1;
        }
      }
      data = (long *)(*xmlMalloc)(0x10);
      if (data == (long *)0x0) {
        xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartDTDAttlist : out of memory!\n");
        writer_local._4_4_ = -1;
      }
      else {
        pxVar4 = xmlStrdup(name);
        *data = (long)pxVar4;
        if (*data == 0) {
          xmlWriterErrMsg(writer,XML_ERR_NO_MEMORY,"xmlTextWriterStartDTDAttlist : out of memory!\n"
                         );
          (*xmlFree)(data);
          writer_local._4_4_ = -1;
        }
        else {
          *(undefined4 *)(data + 1) = 0xb;
          xmlListPushFront(writer->nodes,data);
          if (writer->indent != 0) {
            iVar1 = xmlTextWriterWriteIndent(writer);
            if (iVar1 < 0) {
              return -1;
            }
            lk._0_4_ = iVar1 + (int)lk;
          }
          iVar1 = xmlOutputBufferWriteString(writer->out,"<!ATTLIST ");
          if (iVar1 < 0) {
            writer_local._4_4_ = -1;
          }
          else {
            iVar2 = xmlOutputBufferWriteString(writer->out,(char *)name);
            if (iVar2 < 0) {
              writer_local._4_4_ = -1;
            }
            else {
              writer_local._4_4_ = iVar2 + iVar1 + (int)lk;
            }
          }
        }
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterStartDTDAttlist(xmlTextWriterPtr writer, const xmlChar * name)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL || name == NULL || *name == '\0')
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk == 0) {
        return -1;
    }

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p != 0) {
        switch (p->state) {
            case XML_TEXTWRITER_DTD:
                count = xmlOutputBufferWriteString(writer->out, " [");
                if (count < 0)
                    return -1;
                sum += count;
                if (writer->indent) {
                    count = xmlOutputBufferWriteString(writer->out, "\n");
                    if (count < 0)
                        return -1;
                    sum += count;
                }
                p->state = XML_TEXTWRITER_DTD_TEXT;
                /* fallthrough */
            case XML_TEXTWRITER_DTD_TEXT:
            case XML_TEXTWRITER_NONE:
                break;
            default:
                return -1;
        }
    }

    p = (xmlTextWriterStackEntry *)
        xmlMalloc(sizeof(xmlTextWriterStackEntry));
    if (p == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartDTDAttlist : out of memory!\n");
        return -1;
    }

    p->name = xmlStrdup(name);
    if (p->name == 0) {
        xmlWriterErrMsg(writer, XML_ERR_NO_MEMORY,
                        "xmlTextWriterStartDTDAttlist : out of memory!\n");
        xmlFree(p);
        return -1;
    }
    p->state = XML_TEXTWRITER_DTD_ATTL;

    xmlListPushFront(writer->nodes, p);

    if (writer->indent) {
        count = xmlTextWriterWriteIndent(writer);
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, "<!ATTLIST ");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWriteString(writer->out, (const char *) name);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}